

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::DefaultReadCordTest_ReadSmallCord_Test::
DefaultReadCordTest_ReadSmallCord_Test(DefaultReadCordTest_ReadSmallCord_Test *this)

{
  DefaultReadCordTest_ReadSmallCord_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__DefaultReadCordTest_ReadSmallCord_Test_02a1dfc8;
  return;
}

Assistant:

TEST(DefaultReadCordTest, ReadSmallCord) {
  std::string source = "abcdefghijk";
  ArrayInputStream input(source.data(), source.size());

  absl::Cord dest;
  EXPECT_TRUE(input.Skip(1));
  EXPECT_TRUE(input.ReadCord(&dest, source.size() - 2));

  EXPECT_EQ(dest, "bcdefghij");
}